

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

void __thiscall raptor::TcpServer::RefreshTime(TcpServer *this,uint32_t index)

{
  bool bVar1;
  reference pvVar2;
  time_t tVar3;
  pair<const_long,_unsigned_int> local_68;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  long local_30;
  time_t deadline_seconds;
  AutoMutex local_20;
  AutoMutex g;
  uint32_t index_local;
  TcpServer *this_local;
  
  g._mutex._4_4_ = index;
  AutoMutex::AutoMutex(&local_20,&this->_conn_mtx);
  pvVar2 = std::
           vector<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>,_std::allocator<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>_>_>
           ::operator[](&this->_mgr,(ulong)g._mutex._4_4_);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pvVar2);
  if (bVar1) {
    tVar3 = Now();
    local_30 = tVar3 + (this->_options).connection_timeout;
    pvVar2 = std::
             vector<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>,_std::allocator<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>_>_>
             ::operator[](&this->_mgr,(ulong)g._mutex._4_4_);
    local_48 = (pvVar2->second)._M_node;
    local_50 = (_Base_ptr)
               std::
               multimap<long,unsigned_int,std::less<long>,std::allocator<std::pair<long_const,unsigned_int>>>
               ::erase_abi_cxx11_((multimap<long,unsigned_int,std::less<long>,std::allocator<std::pair<long_const,unsigned_int>>>
                                   *)&this->_timeout_record_list,(iterator)local_48);
    std::pair<const_long,_unsigned_int>::pair<long_&,_unsigned_int_&,_true>
              (&local_68,&local_30,(uint *)((long)&g._mutex + 4));
    local_58 = (_Base_ptr)
               std::
               multimap<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>
               ::insert(&this->_timeout_record_list,&local_68);
    pvVar2 = std::
             vector<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>,_std::allocator<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>_>_>
             ::operator[](&this->_mgr,(ulong)g._mutex._4_4_);
    (pvVar2->second)._M_node = local_58;
  }
  deadline_seconds._4_4_ = (uint)!bVar1;
  AutoMutex::~AutoMutex(&local_20);
  return;
}

Assistant:

void TcpServer::RefreshTime(uint32_t index) {
    AutoMutex g(&_conn_mtx);
    if (!_mgr[index].first) {
        return;
    }
    time_t deadline_seconds = Now() + _options.connection_timeout;
    _timeout_record_list.erase(_mgr[index].second);
    _mgr[index].second = _timeout_record_list.insert({deadline_seconds, index});
}